

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::build_function_control_flow_graphs_and_analyze(Compiler *this)

{
  Bitset *this_00;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Types TVar5;
  mapped_type *this_01;
  CFG *this_02;
  SPIRFunction *pSVar6;
  size_type sVar7;
  reference ppVar8;
  VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_> *this_03;
  size_t sVar9;
  TypedID<(diligent_spirv_cross::Types)2> *other;
  TypedID *pTVar10;
  size_type *psVar11;
  Bitset *other_00;
  uint *puVar12;
  SPIRVariable *pSVar13;
  SPIRType *type_00;
  Variant *this_04;
  SPIRConstant *pSVar14;
  bool bVar15;
  SPIRType *type_1;
  SPIRVariable *var;
  uint *id;
  uint *__end2_1;
  uint *__begin2_1;
  SmallVector<unsigned_int,_8UL> *__range2_1;
  TypedID<(diligent_spirv_cross::Types)2> *pTStack_2b8;
  TypedID<(diligent_spirv_cross::Types)2> loop_variable_1;
  TypedID<(diligent_spirv_cross::Types)2> *__end4;
  TypedID<(diligent_spirv_cross::Types)2> *__begin4;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL> *__range4;
  TypedID<(diligent_spirv_cross::Types)2> *pTStack_298;
  TypedID<(diligent_spirv_cross::Types)2> loop_variable;
  TypedID<(diligent_spirv_cross::Types)2> *__end3;
  TypedID<(diligent_spirv_cross::Types)2> *__begin3;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL> *__range3;
  TypedID<(diligent_spirv_cross::Types)0> TStack_274;
  bool invalid_initializers;
  uint32_t type;
  Bitset *flags;
  SPIRBlock *b;
  TypedID<(diligent_spirv_cross::Types)6> *pTStack_258;
  TypedID<(diligent_spirv_cross::Types)6> block;
  TypedID<(diligent_spirv_cross::Types)6> *__end2;
  TypedID<(diligent_spirv_cross::Types)6> *__begin2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_8UL> *__range2;
  AnalyzeVariableScopeAccessHandler scope_handler;
  SPIRFunction *func;
  pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>
  *f;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
  *__range1;
  bool single_function;
  uint32_t local_5c;
  undefined1 local_58 [8];
  CFGBuilder handler;
  Compiler *this_local;
  
  handler.function_cfgs._M_h._M_single_bucket = (__node_base_ptr)this;
  CFGBuilder::CFGBuilder((CFGBuilder *)local_58,this);
  local_5c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  this_01 = ::std::
            unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
            ::operator[]((unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
                          *)&handler.compiler,&local_5c);
  this_02 = (CFG *)::operator_new(0x168);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  pSVar6 = get<diligent_spirv_cross::SPIRFunction>(this,uVar3);
  CFG::CFG(this_02,this,pSVar6);
  ::std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>::
  reset(this_01,this_02);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  pSVar6 = get<diligent_spirv_cross::SPIRFunction>(this,uVar3);
  traverse_all_reachable_opcodes(this,pSVar6,(OpcodeHandler *)local_58);
  ::std::
  unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
  ::operator=(&this->function_cfgs,
              (unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
               *)&handler.compiler);
  sVar7 = ::std::
          unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
          ::size(&this->function_cfgs);
  __end1 = ::std::
           unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
           ::begin(&this->function_cfgs);
  f = (pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>
       *)::std::
         unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
         ::end(&this->function_cfgs);
  do {
    bVar1 = ::std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
                         *)&f);
    if (!bVar1) {
      if (sVar7 >= 2) {
        __end2_1 = VectorView<unsigned_int>::begin
                             (&(this->global_variables).super_VectorView<unsigned_int>);
        puVar12 = VectorView<unsigned_int>::end
                            (&(this->global_variables).super_VectorView<unsigned_int>);
        for (; __end2_1 != puVar12; __end2_1 = __end2_1 + 1) {
          pSVar13 = get<diligent_spirv_cross::SPIRVariable>(this,*__end2_1);
          type_00 = get_variable_data_type(this,pSVar13);
          bVar1 = is_array(this,type_00);
          if ((((bVar1) && (pSVar13->storage == Private)) &&
              (uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar13->initializer),
              uVar3 != 0)) && ((pSVar13->is_written_to & 1U) == 0)) {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar13->initializer);
            this_04 = VectorView<diligent_spirv_cross::Variant>::operator[]
                                (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,
                                 (ulong)uVar3);
            TVar5 = Variant::get_type(this_04);
            if (TVar5 == TypeConstant) {
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar13->initializer);
              pSVar14 = get<diligent_spirv_cross::SPIRConstant>(this,uVar3);
              pSVar14->is_used_as_lut = true;
              (pSVar13->static_expression).id = (pSVar13->initializer).id;
              pSVar13->statically_assigned = true;
              pSVar13->remapped_variable = true;
            }
          }
        }
      }
      CFGBuilder::~CFGBuilder((CFGBuilder *)local_58);
      return;
    }
    ppVar8 = ::std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false,_false>
             ::operator*(&__end1);
    scope_handler.current_block =
         (SPIRBlock *)get<diligent_spirv_cross::SPIRFunction>(this,ppVar8->first);
    AnalyzeVariableScopeAccessHandler::AnalyzeVariableScopeAccessHandler
              ((AnalyzeVariableScopeAccessHandler *)&__range2,this,
               (SPIRFunction *)scope_handler.current_block);
    analyze_variable_scope
              (this,(SPIRFunction *)scope_handler.current_block,
               (AnalyzeVariableScopeAccessHandler *)&__range2);
    find_function_local_luts
              (this,(SPIRFunction *)scope_handler.current_block,
               (AnalyzeVariableScopeAccessHandler *)&__range2,sVar7 < 2);
    this_03 = (VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_> *)
              (((scope_handler.current_block)->potential_declare_temporary).stack_storage.
               aligned_char + 0x20);
    __end2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>::begin
                       (this_03);
    pTStack_258 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>::end
                            (this_03);
    for (; __end2 != pTStack_258; __end2 = __end2 + 1) {
      b._4_4_ = __end2->id;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&b + 4));
      flags = (Bitset *)get<diligent_spirv_cross::SPIRBlock>(this,uVar3);
      sVar9 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::size
                        (&(((SPIRBlock *)flags)->loop_variables).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                        );
      if (1 < sVar9) {
        other = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::front
                          ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                            *)&flags[0xd].higher._M_h._M_element_count);
        TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
                  (&stack0xfffffffffffffd8c,other);
        _type = get_decoration_bitset(this,(ID)TStack_274.id);
        pTVar10 = (TypedID *)
                  VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::front
                            ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                              *)&flags[0xd].higher._M_h._M_element_count);
        uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar10);
        pSVar13 = get<diligent_spirv_cross::SPIRVariable>(this,uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSVar13->super_IVariant).field_0xc);
        bVar1 = false;
        psVar11 = &flags[0xd].higher._M_h._M_element_count;
        __end3 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::begin
                           ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                             *)psVar11);
        pTStack_298 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::
                      end((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                           *)psVar11);
        for (; this_00 = _type, __end3 != pTStack_298; __end3 = __end3 + 1) {
          __range4._4_4_ = __end3->id;
          TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
                    ((TypedID<(diligent_spirv_cross::Types)0> *)&__range4,
                     (TypedID<(diligent_spirv_cross::Types)2> *)((long)&__range4 + 4));
          other_00 = get_decoration_bitset(this,__range4._0_4_);
          bVar2 = Bitset::operator!=(this_00,other_00);
          bVar15 = true;
          if (!bVar2) {
            pTVar10 = (TypedID *)
                      VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::
                      front((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                             *)&flags[0xd].higher._M_h._M_element_count);
            uVar4 = TypedID::operator_cast_to_unsigned_int(pTVar10);
            pSVar13 = get<diligent_spirv_cross::SPIRVariable>(this,uVar4);
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar13->super_IVariant).field_0xc);
            bVar15 = uVar3 != uVar4;
          }
          if (bVar15) {
            bVar1 = true;
            break;
          }
        }
        if (bVar1) {
          psVar11 = &flags[0xd].higher._M_h._M_element_count;
          __end4 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::begin
                             ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                               *)psVar11);
          pTStack_2b8 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::
                        end((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                             *)psVar11);
          for (; __end4 != pTStack_2b8; __end4 = __end4 + 1) {
            __range2_1._4_4_ = __end4->id;
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2_1 + 4));
            pSVar13 = get<diligent_spirv_cross::SPIRVariable>(this,uVar3);
            pSVar13->loop_variable = false;
          }
          SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL>::clear
                    ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL>
                      *)&flags[0xd].higher._M_h._M_element_count);
        }
      }
    }
    AnalyzeVariableScopeAccessHandler::~AnalyzeVariableScopeAccessHandler
              ((AnalyzeVariableScopeAccessHandler *)&__range2);
    ::std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false,_false>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Compiler::build_function_control_flow_graphs_and_analyze()
{
	CFGBuilder handler(*this);
	handler.function_cfgs[ir.default_entry_point].reset(new CFG(*this, get<SPIRFunction>(ir.default_entry_point)));
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	function_cfgs = std::move(handler.function_cfgs);
	bool single_function = function_cfgs.size() <= 1;

	for (auto &f : function_cfgs)
	{
		auto &func = get<SPIRFunction>(f.first);
		AnalyzeVariableScopeAccessHandler scope_handler(*this, func);
		analyze_variable_scope(func, scope_handler);
		find_function_local_luts(func, scope_handler, single_function);

		// Check if we can actually use the loop variables we found in analyze_variable_scope.
		// To use multiple initializers, we need the same type and qualifiers.
		for (auto block : func.blocks)
		{
			auto &b = get<SPIRBlock>(block);
			if (b.loop_variables.size() < 2)
				continue;

			auto &flags = get_decoration_bitset(b.loop_variables.front());
			uint32_t type = get<SPIRVariable>(b.loop_variables.front()).basetype;
			bool invalid_initializers = false;
			for (auto loop_variable : b.loop_variables)
			{
				if (flags != get_decoration_bitset(loop_variable) ||
				    type != get<SPIRVariable>(b.loop_variables.front()).basetype)
				{
					invalid_initializers = true;
					break;
				}
			}

			if (invalid_initializers)
			{
				for (auto loop_variable : b.loop_variables)
					get<SPIRVariable>(loop_variable).loop_variable = false;
				b.loop_variables.clear();
			}
		}
	}

	// Find LUTs which are not function local. Only consider this case if the CFG is multi-function,
	// otherwise we treat Private as Function trivially.
	// Needs to be analyzed from the outside since we have to block the LUT optimization if at least
	// one function writes to it.
	if (!single_function)
	{
		for (auto &id : global_variables)
		{
			auto &var = get<SPIRVariable>(id);
			auto &type = get_variable_data_type(var);

			if (is_array(type) && var.storage == StorageClassPrivate &&
			    var.initializer && !var.is_written_to &&
			    ir.ids[var.initializer].get_type() == TypeConstant)
			{
				get<SPIRConstant>(var.initializer).is_used_as_lut = true;
				var.static_expression = var.initializer;
				var.statically_assigned = true;
				var.remapped_variable = true;
			}
		}
	}
}